

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::AST_Node::to_string(string *__return_storage_ptr__,AST_Node *this,string *t_prepend)

{
  pointer psVar1;
  AST_Node *this_00;
  ostream *poVar2;
  pointer psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,(string *)t_prepend);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(&PTR_anon_var_dwarf_d71b6_00328780)[this->identifier]);
  poVar2 = std::operator<<(poVar2,") ");
  poVar2 = std::operator<<(poVar2,(string *)&this->text);
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->location).start.line);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->location).start.column);
  std::operator<<(poVar2,'\n');
  psVar1 = (this->children).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->children).
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    this_00 = (psVar3->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::operator+(&local_1e8,t_prepend,"  ");
    to_string(&local_1c8,this_00,&local_1e8);
    std::operator<<((ostream *)&oss,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::string &t_prepend = "") const {
        std::ostringstream oss;

        oss << t_prepend << "(" << ast_node_type_to_string(this->identifier) << ") "
            << this->text << " : " << this->location.start.line << ", " << this->location.start.column << '\n';

        for (auto & elem : this->children) {
          oss << elem->to_string(t_prepend + "  ");
        }
        return oss.str();
      }